

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface.cc
# Opt level: O1

bool __thiscall
google::protobuf::compiler::CommandLineInterface::GeneratePluginOutput
          (CommandLineInterface *this,
          vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
          *parsed_files,string *plugin_name,string *parameter,GeneratorContext *generator_context,
          string *error)

{
  uint uVar1;
  pointer pcVar2;
  pointer ppFVar3;
  FileDescriptor *file;
  undefined8 uVar4;
  FileDescriptorProto *file_proto;
  long lVar5;
  void *__src;
  anon_union_8_1_a8a14541_for_iterator_2 aVar6;
  vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
  *parsed_files_00;
  byte bVar7;
  bool bVar8;
  int iVar9;
  int iVar10;
  string *psVar11;
  Rep *pRVar12;
  FileDescriptorProto *pFVar13;
  FileDescriptorProto *pFVar14;
  size_t sVar15;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::compiler::CodeGeneratorResponse_File>_>
  *pVVar16;
  long *plVar17;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined8 *puVar19;
  raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<std::__cxx11::string>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::__cxx11::string>>
  *this_00;
  ulong uVar20;
  GeneratedCodeInfo *pGVar21;
  ulong uVar22;
  anon_union_8_1_a8a14541_for_iterator_2 aVar23;
  pointer ppFVar24;
  RepeatedPtrFieldBase *pRVar25;
  pointer __old_p;
  string *program;
  anon_union_8_1_a8a14541_for_iterator_2 *this_01;
  RepeatedPtrFieldBase *this_02;
  bool bVar26;
  iterator iVar27;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  parts;
  Subprocess subprocess;
  int size;
  string communicate_error;
  string processed_parameter;
  void *data;
  flat_hash_set<const_google::protobuf::FileDescriptor_*,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Hash,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
  already_seen;
  CodeGeneratorResponse response;
  flat_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  files_to_generate;
  CodeGeneratorRequest request;
  anon_union_8_1_a8a14541_for_iterator_2 local_208;
  anon_union_8_1_a8a14541_for_iterator_2 aStack_200;
  char *local_1f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paStack_1f0;
  char *local_1e8 [2];
  long *local_1d8;
  undefined2 local_1d0;
  byte local_1ce;
  undefined1 local_1cd;
  anon_union_8_1_a8a14541_for_iterator_2 local_1c8;
  undefined8 local_1c0;
  string *local_1b0;
  anon_union_8_1_a8a14541_for_iterator_2 local_1a8;
  uint local_19c;
  string local_198;
  vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
  *local_178;
  GeneratorContext *local_170;
  size_t *local_168;
  size_t local_160;
  size_t local_158 [2];
  anon_union_8_1_a8a14541_for_iterator_2 local_148;
  pointer local_140;
  undefined1 local_138;
  undefined7 uStack_137;
  raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<const_google::protobuf::FileDescriptor_*>,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Hash,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
  local_128;
  undefined1 local_108 [72];
  raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_c0;
  undefined1 local_a0 [16];
  undefined1 local_90 [56];
  undefined1 local_58 [24];
  string local_40 [16];
  long *plVar18;
  
  local_1b0 = error;
  local_170 = generator_context;
  CodeGeneratorRequest::CodeGeneratorRequest((CodeGeneratorRequest *)local_a0,(Arena *)0x0);
  CodeGeneratorResponse::CodeGeneratorResponse((CodeGeneratorResponse *)local_108,(Arena *)0x0);
  local_168 = local_158;
  pcVar2 = (parameter->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_168,pcVar2,pcVar2 + parameter->_M_string_length);
  local_128.settings_.
  super_CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<absl::lts_20240722::container_internal::CommonFields,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Hash,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::FileDescriptor_*>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
  .super_Storage<absl::lts_20240722::container_internal::CommonFields,_0UL,_false>.value.capacity_ =
       local_160;
  local_128.settings_.
  super_CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<absl::lts_20240722::container_internal::CommonFields,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Hash,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::FileDescriptor_*>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
  .super_Storage<absl::lts_20240722::container_internal::CommonFields,_0UL,_false>.value.size_ =
       (size_t)local_168;
  local_128.settings_.
  super_CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<absl::lts_20240722::container_internal::CommonFields,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Hash,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::FileDescriptor_*>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
  .super_Storage<absl::lts_20240722::container_internal::CommonFields,_0UL,_false>.value.
  heap_or_soo_.soo_data[0] = ',';
  absl::lts_20240722::strings_internal::
  Splitter<absl::lts_20240722::ByChar,_absl::lts_20240722::AllowEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>
  ::
  ConvertToContainer<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  ::operator()((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_208,
               (ConvertToContainer<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                *)&local_c0,
               (Splitter<absl::lts_20240722::ByChar,_absl::lts_20240722::AllowEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>
                *)&local_128);
  aVar6 = aStack_200;
  aVar23 = local_208;
  bVar26 = local_208.slot_ != aStack_200.slot_;
  if (bVar26) {
    iVar9 = std::__cxx11::string::compare((char *)local_208.slot_);
    while (iVar9 != 0) {
      aVar23.slot_ = (slot_type *)((long)aVar23.slot_ + 0x20);
      bVar26 = aVar23.slot_ != aVar6.slot_;
      if (aVar23.slot_ == aVar6.slot_) break;
      iVar9 = std::__cxx11::string::compare((char *)aVar23.slot_);
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_208);
  if (local_160 != 0) {
    local_90[0] = local_90[0] | 1;
    google::protobuf::internal::ArenaStringPtr::Set<>(local_40,(Arena *)&local_168);
  }
  local_128.settings_.
  super_CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<absl::lts_20240722::container_internal::CommonFields,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Hash,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::FileDescriptor_*>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
  .super_Storage<absl::lts_20240722::container_internal::CommonFields,_0UL,_false>.value.capacity_ =
       1;
  local_128.settings_.
  super_CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<absl::lts_20240722::container_internal::CommonFields,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Hash,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::FileDescriptor_*>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
  .super_Storage<absl::lts_20240722::container_internal::CommonFields,_0UL,_false>.value.size_ = 0;
  ppFVar24 = (parsed_files->
             super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
             )._M_impl.super__Vector_impl_data._M_start;
  ppFVar3 = (parsed_files->
            super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  local_178 = parsed_files;
  if (ppFVar24 != ppFVar3) {
    do {
      file = *ppFVar24;
      psVar11 = (string *)google::protobuf::internal::RepeatedPtrFieldBase::AddString();
      std::__cxx11::string::_M_assign(psVar11);
      local_208._0_3_ = 0x10101;
      GetTransitiveDependencies
                (this,file,
                 (flat_hash_set<const_google::protobuf::FileDescriptor_*,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Hash,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                  *)&local_128,
                 (RepeatedPtrField<google::protobuf::FileDescriptorProto> *)(local_90 + 0x20),
                 (TransitiveDependencyOptions *)&local_208);
      ppFVar24 = ppFVar24 + 1;
    } while (ppFVar24 != ppFVar3);
  }
  if ((local_178->
      super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
      )._M_impl.super__Vector_impl_data._M_start ==
      (local_178->
      super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
      )._M_impl.super__Vector_impl_data._M_finish) {
    absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_208,
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/compiler/command_line_interface.cc"
               ,0xae3,0x15,"!parsed_files.empty()");
    absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_208);
  }
  uVar4 = *(undefined8 *)
           (*(local_178->
             super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
             )._M_impl.super__Vector_impl_data._M_start + 0x18);
  absl::lts_20240722::container_internal::
  raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<std::__cxx11::string>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::__cxx11::string>>
  ::
  raw_hash_set<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
            ((raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<std::__cxx11::string>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::__cxx11::string>>
              *)&local_c0,
             (this->input_files_).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start,
             (this->input_files_).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish,0,(hasher *)&local_208,
             (key_equal *)&local_198,(allocator_type *)&local_148);
  if ((GeneratePluginOutput(std::vector<google::protobuf::FileDescriptor_const*,std::allocator<google::protobuf::FileDescriptor_const*>>const&,std::__cxx11::string_const&,std::__cxx11::string_const&,google::protobuf::compiler::GeneratorContext*,std::__cxx11::string*)
       ::builtin_plugins_abi_cxx11_ == '\0') &&
     (iVar9 = __cxa_guard_acquire(&GeneratePluginOutput(std::vector<google::protobuf::FileDescriptor_const*,std::allocator<google::protobuf::FileDescriptor_const*>>const&,std::__cxx11::string_const&,std::__cxx11::string_const&,google::protobuf::compiler::GeneratorContext*,std::__cxx11::string*)
                                   ::builtin_plugins_abi_cxx11_), iVar9 != 0)) {
    this_00 = (raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<std::__cxx11::string>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::__cxx11::string>>
               *)operator_new(0x20);
    local_1f8 = "protoc-gen-mutable_java";
    paStack_1f0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)0x347094;
    local_208.slot_ = (slot_type *)0x34705d;
    aStack_200.slot_ = (slot_type *)0x34706c;
    absl::lts_20240722::container_internal::
    raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<std::__cxx11::string>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::__cxx11::string>>
    ::raw_hash_set<char_const*const*>
              (this_00,(char **)&local_208.slot_,local_1e8,0,(hasher *)&local_198,
               (key_equal *)&local_148,(allocator_type *)&local_1a8);
    GeneratePluginOutput(std::vector<google::protobuf::FileDescriptor_const*,std::allocator<google::protobuf::FileDescriptor_const*>>const&,std::__cxx11::string_const&,std::__cxx11::string_const&,google::protobuf::compiler::GeneratorContext*,std::__cxx11::string*)
    ::builtin_plugins_abi_cxx11_ =
         (flat_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)this_00;
    __cxa_guard_release(&GeneratePluginOutput(std::vector<google::protobuf::FileDescriptor_const*,std::allocator<google::protobuf::FileDescriptor_const*>>const&,std::__cxx11::string_const&,std::__cxx11::string_const&,google::protobuf::compiler::GeneratorContext*,std::__cxx11::string*)
                         ::builtin_plugins_abi_cxx11_);
  }
  this_02 = (RepeatedPtrFieldBase *)(local_90 + 0x20);
  pRVar25 = this_02;
  if ((local_90[0x20] & 1) != 0) {
    pRVar12 = protobuf::internal::RepeatedPtrFieldBase::rep(this_02);
    pRVar25 = (RepeatedPtrFieldBase *)pRVar12->elements;
  }
  if ((local_90[0x20] & 1) != 0) {
    pRVar12 = protobuf::internal::RepeatedPtrFieldBase::rep(this_02);
    this_02 = (RepeatedPtrFieldBase *)pRVar12->elements;
  }
  if (pRVar25 != (RepeatedPtrFieldBase *)(&this_02->tagged_rep_or_elem_ + (int)local_90._40_4_)) {
    do {
      file_proto = (FileDescriptorProto *)pRVar25->tagged_rep_or_elem_;
      iVar27 = absl::lts_20240722::container_internal::
               raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<std::__cxx11::string>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::__cxx11::string>>
               ::find<std::__cxx11::string>
                         ((raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<std::__cxx11::string>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::__cxx11::string>>
                           *)&local_c0,
                          (key_arg<std::__cxx11::basic_string<char>_> *)
                          (*(ulong *)(file_proto + 0xb0) & 0xfffffffffffffffc));
      if (iVar27.ctrl_ != (ctrl_t *)0x0) {
        pFVar13 = (FileDescriptorProto *)
                  google::protobuf::DescriptorPool::FindFileByName
                            (uVar4,((undefined8 *)
                                   (*(ulong *)(file_proto + 0xb0) & 0xfffffffffffffffc))[1],
                             *(undefined8 *)(*(ulong *)(file_proto + 0xb0) & 0xfffffffffffffffc));
        pFVar14 = (FileDescriptorProto *)
                  google::protobuf::internal::RepeatedPtrFieldBase::AddMessageLite
                            ((_func_void_ptr_Arena_ptr *)local_58);
        if (pFVar14 != file_proto) {
          uVar20 = *(ulong *)(pFVar14 + 8);
          if ((uVar20 & 1) != 0) {
            uVar20 = *(ulong *)(uVar20 & 0xfffffffffffffffe);
          }
          uVar22 = *(ulong *)(file_proto + 8);
          if ((uVar22 & 1) != 0) {
            uVar22 = *(ulong *)(uVar22 & 0xfffffffffffffffe);
          }
          if (uVar20 == uVar22) {
            google::protobuf::FileDescriptorProto::InternalSwap(pFVar14);
          }
          else {
            google::protobuf::FileDescriptorProto::CopyFrom(pFVar14);
          }
        }
        google::protobuf::FileDescriptor::CopyTo(pFVar13);
        if (!bVar26) {
          google::protobuf::FileDescriptor::CopySourceCodeInfoTo(pFVar13);
          iVar27 = absl::lts_20240722::container_internal::
                   raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<std::__cxx11::string>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::__cxx11::string>>
                   ::find<std::__cxx11::string>
                             ((raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<std::__cxx11::string>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::__cxx11::string>>
                               *)GeneratePluginOutput(std::vector<google::protobuf::FileDescriptor_const*,std::allocator<google::protobuf::FileDescriptor_const*>>const&,std::__cxx11::string_const&,std::__cxx11::string_const&,google::protobuf::compiler::GeneratorContext*,std::__cxx11::string*)
                                 ::builtin_plugins_abi_cxx11_,plugin_name);
          if (iVar27.ctrl_ == (ctrl_t *)0x0) {
            google::protobuf::FileDescriptor::CopyJsonNameTo(pFVar13);
          }
        }
        StripSourceRetentionOptions(*(DescriptorPool **)(pFVar13 + 0x18),file_proto);
      }
      pRVar25 = (RepeatedPtrFieldBase *)&pRVar25->current_size_;
    } while (pRVar25 !=
             (RepeatedPtrFieldBase *)(&this_02->tagged_rep_or_elem_ + (int)local_90._40_4_));
  }
  local_90[0] = local_90[0] | 2;
  if ((Version *)local_40._8_8_ == (Version *)0x0) {
    if ((local_a0._8_8_ & 1) != 0) {
      local_a0._8_8_ = *(undefined8 *)(local_a0._8_8_ & 0xfffffffffffffffe);
    }
    local_40._8_8_ =
         Arena::DefaultConstruct<google::protobuf::compiler::Version>((Arena *)local_a0._8_8_);
  }
  *(undefined8 *)((long)(local_40._8_8_ + 0x10) + 0x10) = 0x1d00000005;
  (((anon_union_32_1_493b367e_for_Version_4 *)(local_40._8_8_ + 0x10))->_impl_).patch_ = 2;
  *(byte *)(local_40._8_8_ + 0x10) = *(byte *)(local_40._8_8_ + 0x10) | 0xf;
  uVar20 = *(ulong *)(local_40._8_8_ + 8);
  if ((uVar20 & 1) != 0) {
    uVar20 = *(ulong *)(uVar20 & 0xfffffffffffffffe);
  }
  google::protobuf::internal::ArenaStringPtr::Set
            ((undefined1 *)((long)(local_40._8_8_ + 0x10) + 8),0,"",uVar20);
  Subprocess::Subprocess((Subprocess *)&local_1a8);
  sVar15 = absl::lts_20240722::container_internal::
           raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::__cxx11::string,std::__cxx11::string>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
           ::count<std::__cxx11::string>
                     ((raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::__cxx11::string,std::__cxx11::string>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                       *)&this->plugins_,plugin_name);
  program = plugin_name;
  if (sVar15 != 0) {
    absl::lts_20240722::container_internal::
    raw_hash_map<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::__cxx11::string,std::__cxx11::string>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
    ::try_emplace_impl<std::__cxx11::string_const&>
              ((pair<absl::lts_20240722::container_internal::raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
                *)&local_208,
               (raw_hash_map<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::__cxx11::string,std::__cxx11::string>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                *)&this->plugins_,plugin_name);
    program = (string *)((long)aStack_200.slot_ + 0x20);
  }
  Subprocess::Start((Subprocess *)&local_1a8,program,(uint)(sVar15 != 0));
  local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
  local_198._M_string_length = 0;
  local_198.field_2._M_local_buf[0] = '\0';
  this_01 = &local_1a8;
  bVar26 = Subprocess::Communicate
                     ((Subprocess *)this_01,(Message *)local_a0,(Message *)local_108,&local_198);
  if (bVar26) {
    iVar9 = 0;
    if ((int)local_108._32_4_ < 1) {
      plVar18 = (long *)0x0;
    }
    else {
      plVar18 = (long *)0x0;
      do {
        pVVar16 = protobuf::internal::RepeatedPtrFieldBase::
                  Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::compiler::CodeGeneratorResponse_File>>
                            ((RepeatedPtrFieldBase *)(local_108 + 0x18),iVar9);
        if (*(long *)(((ulong)(pVVar16->field_0)._impl_.insertion_point_.tagged_ptr_.ptr_ &
                      0xfffffffffffffffc) + 8) == 0) {
          if (*(long *)(((ulong)(pVVar16->field_0)._impl_.name_.tagged_ptr_.ptr_ &
                        0xfffffffffffffffc) + 8) == 0) {
            if (plVar18 == (long *)0x0) {
              local_140 = (plugin_name->_M_dataplus)._M_p;
              local_148 = (anon_union_8_1_a8a14541_for_iterator_2)plugin_name->_M_string_length;
              aStack_200.slot_ = (slot_type *)0x0;
              local_1f8 = (char *)((ulong)local_1f8 & 0xffffffffffffff00);
              local_208.slot_ = (slot_type *)&local_1f8;
              absl::lts_20240722::substitute_internal::SubstituteAndAppendArray
                        (&local_208,0x44,
                         "$0: First file chunk returned by plugin did not specify a file name.",
                         &local_148,1);
              std::__cxx11::string::operator=((string *)local_1b0,(string *)&local_208);
              if (local_208.slot_ != (slot_type *)&local_1f8) {
                operator_delete(local_208.slot_,(ulong)(local_1f8 + 1));
              }
              goto LAB_0016be7c;
            }
          }
          else {
            if (plVar18 != (long *)0x0) {
              (**(code **)(*plVar18 + 8))(plVar18);
            }
            iVar10 = (*local_170->_vptr_GeneratorContext[2])
                               (local_170,
                                (ulong)(pVVar16->field_0)._impl_.name_.tagged_ptr_.ptr_ &
                                0xfffffffffffffffc);
            plVar18 = (long *)CONCAT44(extraout_var_00,iVar10);
          }
        }
        else {
          plVar17 = (long *)((ulong)(pVVar16->field_0)._impl_.name_.tagged_ptr_.ptr_ &
                            0xfffffffffffffffc);
          lVar5 = *plVar17;
          local_208.slot_ = (slot_type *)&local_1f8;
          std::__cxx11::string::_M_construct<char*>((string *)&local_208,lVar5,plVar17[1] + lVar5);
          if (plVar18 != (long *)0x0) {
            (**(code **)(*plVar18 + 8))(plVar18);
          }
          pGVar21 = (pVVar16->field_0)._impl_.generated_code_info_;
          if (pGVar21 == (GeneratedCodeInfo *)0x0) {
            pGVar21 = (GeneratedCodeInfo *)&_GeneratedCodeInfo_default_instance_;
          }
          iVar10 = (*local_170->_vptr_GeneratorContext[5])
                             (local_170,&local_208,
                              (ulong)(pVVar16->field_0)._impl_.insertion_point_.tagged_ptr_.ptr_ &
                              0xfffffffffffffffc,pGVar21);
          plVar18 = (long *)CONCAT44(extraout_var,iVar10);
          if (local_208.slot_ != (slot_type *)&local_1f8) {
            operator_delete(local_208.slot_,(ulong)(local_1f8 + 1));
          }
        }
        local_1ce = (byte)io::CodedOutputStream::default_serialization_deterministic_ & 1;
        local_1d0 = 0;
        local_1cd = 0;
        local_208.slot_ = (slot_type *)&local_1f8;
        aStack_200.slot_ = (slot_type *)&local_1f8;
        local_1d8 = plVar18;
        local_1c8.slot_ = (slot_type *)&local_1f8;
        local_1c0 = (**(code **)(*plVar18 + 0x20))(plVar18);
        bVar7 = (**(code **)(*plVar18 + 0x10))(plVar18,&local_148,&local_19c);
        if ((bVar7 & 0 < (int)local_19c) == 1) {
          aVar23.slot_ = (slot_type *)((long)local_148.slot_ + -0x10);
          if ((int)local_19c < 0x11) {
            aVar23.slot_ = (slot_type *)&local_1f8;
          }
          local_208.slot_ = (slot_type *)((long)aVar23.slot_ + (ulong)local_19c);
          aStack_200.slot_ = (slot_type *)0x0;
          local_1c8 = local_148;
          if ((int)local_19c < 0x11) {
            aStack_200 = local_148;
            local_1c8.slot_ = (slot_type *)&local_1f8;
          }
        }
        aVar23 = local_1c8;
        puVar19 = (undefined8 *)
                  ((ulong)(pVVar16->field_0)._impl_.content_.tagged_ptr_.ptr_ & 0xfffffffffffffffc);
        __src = (void *)*puVar19;
        uVar1 = *(uint *)(puVar19 + 1);
        if ((long)local_208.slot_ - (long)local_1c8 < (long)(int)uVar1) {
          local_1c8.slot_ =
               (slot_type *)
               google::protobuf::io::EpsCopyOutputStream::WriteRawFallback
                         (&local_208,(int)__src,(uchar *)(ulong)uVar1);
        }
        else {
          memcpy(local_1c8.slot_,__src,(size_t)(ulong)uVar1);
          local_1c8.slot_ = (slot_type *)((long)(int)uVar1 + (long)aVar23.slot_);
        }
        this_01 = &local_208;
        google::protobuf::io::CodedOutputStream::~CodedOutputStream((CodedOutputStream *)&local_208)
        ;
        iVar9 = iVar9 + 1;
      } while (iVar9 < (int)local_108._32_4_);
    }
    parsed_files_00 = local_178;
    bVar26 = EnforceProto3OptionalSupport
                       ((CommandLineInterface *)this_01,plugin_name,local_108._56_8_,local_178);
    bVar8 = EnforceEditionsSupport
                      (this,plugin_name,local_108._56_8_,local_108._64_4_,local_108._68_4_,
                       parsed_files_00);
    if (*(long *)((local_108._48_8_ & 0xfffffffffffffffc) + 8) == 0) {
      bVar26 = bVar26 && bVar8;
    }
    else {
      std::__cxx11::string::_M_assign((string *)local_1b0);
LAB_0016be7c:
      bVar26 = false;
    }
    if (plVar18 != (long *)0x0) {
      (**(code **)(*plVar18 + 8))(plVar18);
    }
  }
  else {
    aStack_200 = (anon_union_8_1_a8a14541_for_iterator_2)(plugin_name->_M_dataplus)._M_p;
    local_208 = (anon_union_8_1_a8a14541_for_iterator_2)plugin_name->_M_string_length;
    local_140 = (pointer)0x0;
    local_138 = 0;
    local_1f8 = (char *)local_198._M_string_length;
    paStack_1f0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_198._M_dataplus._M_p;
    local_148.slot_ = (slot_type *)&local_138;
    absl::lts_20240722::substitute_internal::SubstituteAndAppendArray
              (&local_148,6,"$0: $1",&local_208,2);
    std::__cxx11::string::operator=((string *)local_1b0,(string *)&local_148);
    if (local_148.slot_ != (slot_type *)&local_138) {
      operator_delete(local_148.slot_,CONCAT71(uStack_137,local_138) + 1);
    }
    bVar26 = false;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_198._M_dataplus._M_p != &local_198.field_2) {
    operator_delete(local_198._M_dataplus._M_p,
                    CONCAT71(local_198.field_2._M_allocated_capacity._1_7_,
                             local_198.field_2._M_local_buf[0]) + 1);
  }
  Subprocess::~Subprocess((Subprocess *)&local_1a8);
  absl::lts_20240722::container_internal::
  raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~raw_hash_set(&local_c0);
  absl::lts_20240722::container_internal::
  raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<const_google::protobuf::FileDescriptor_*>,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Hash,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
  ::~raw_hash_set(&local_128);
  if (local_168 != local_158) {
    operator_delete(local_168,local_158[0] + 1);
  }
  CodeGeneratorResponse::~CodeGeneratorResponse((CodeGeneratorResponse *)local_108);
  CodeGeneratorRequest::~CodeGeneratorRequest((CodeGeneratorRequest *)local_a0);
  return bVar26;
}

Assistant:

bool CommandLineInterface::GeneratePluginOutput(
    const std::vector<const FileDescriptor*>& parsed_files,
    const std::string& plugin_name, const std::string& parameter,
    GeneratorContext* generator_context, std::string* error) {
  CodeGeneratorRequest request;
  CodeGeneratorResponse response;
  std::string processed_parameter = parameter;

  bool bootstrap = GetBootstrapParam(processed_parameter);

  // Build the request.
  if (!processed_parameter.empty()) {
    request.set_parameter(processed_parameter);
  }


  absl::flat_hash_set<const FileDescriptor*> already_seen;
  for (const FileDescriptor* file : parsed_files) {
    request.add_file_to_generate(file->name());
    GetTransitiveDependencies(file, &already_seen, request.mutable_proto_file(),
                              {/*.include_json_name =*/true,
                               /*.include_source_code_info =*/true,
                               /*.retain_options =*/true});
  }

  // Populate source_file_descriptors and remove source-retention options from
  // proto_file.
  ABSL_CHECK(!parsed_files.empty());
  const DescriptorPool* pool = parsed_files[0]->pool();
  absl::flat_hash_set<std::string> files_to_generate(input_files_.begin(),
                                                     input_files_.end());
  static const auto builtin_plugins = new absl::flat_hash_set<std::string>(
      {"protoc-gen-cpp", "protoc-gen-java", "protoc-gen-mutable_java",
       "protoc-gen-python"});
  for (FileDescriptorProto& file_proto : *request.mutable_proto_file()) {
    if (files_to_generate.contains(file_proto.name())) {
      const FileDescriptor* file = pool->FindFileByName(file_proto.name());
      *request.add_source_file_descriptors() = std::move(file_proto);
      file->CopyTo(&file_proto);
      // Don't populate source code info or json_name for bootstrap protos.
      if (!bootstrap) {
        file->CopySourceCodeInfoTo(&file_proto);

        // The built-in code generators didn't use the json names.
        if (!builtin_plugins->contains(plugin_name)) {
          file->CopyJsonNameTo(&file_proto);
        }
      }
      StripSourceRetentionOptions(*file->pool(), file_proto);
    }
  }

  google::protobuf::compiler::Version* version =
      request.mutable_compiler_version();
  version->set_major(PROTOBUF_VERSION / 1000000);
  version->set_minor(PROTOBUF_VERSION / 1000 % 1000);
  version->set_patch(PROTOBUF_VERSION % 1000);
  version->set_suffix(PROTOBUF_VERSION_SUFFIX);

  // Invoke the plugin.
  Subprocess subprocess;

  if (plugins_.count(plugin_name) > 0) {
    subprocess.Start(plugins_[plugin_name], Subprocess::EXACT_NAME);
  } else {
    subprocess.Start(plugin_name, Subprocess::SEARCH_PATH);
  }

  std::string communicate_error;
  if (!subprocess.Communicate(request, &response, &communicate_error)) {
    *error = absl::Substitute("$0: $1", plugin_name, communicate_error);
    return false;
  }

  // Write the files.  We do this even if there was a generator error in order
  // to match the behavior of a compiled-in generator.
  std::unique_ptr<io::ZeroCopyOutputStream> current_output;
  for (int i = 0; i < response.file_size(); ++i) {
    const CodeGeneratorResponse::File& output_file = response.file(i);

    if (!output_file.insertion_point().empty()) {
      std::string filename = output_file.name();
      // Open a file for insert.
      // We reset current_output to nullptr first so that the old file is closed
      // before the new one is opened.
      current_output.reset();
      current_output.reset(
          generator_context->OpenForInsertWithGeneratedCodeInfo(
              filename, output_file.insertion_point(),
              output_file.generated_code_info()));
    } else if (!output_file.name().empty()) {
      // Starting a new file.  Open it.
      // We reset current_output to nullptr first so that the old file is closed
      // before the new one is opened.
      current_output.reset();
      current_output.reset(generator_context->Open(output_file.name()));
    } else if (current_output == nullptr) {
      *error = absl::Substitute(
          "$0: First file chunk returned by plugin did not specify a file "
          "name.",
          plugin_name);
      return false;
    }

    // Use CodedOutputStream for convenience; otherwise we'd need to provide
    // our own buffer-copying loop.
    io::CodedOutputStream writer(current_output.get());
    writer.WriteString(output_file.content());
  }

  // Check for errors.
  bool success = true;
  if (!EnforceProto3OptionalSupport(plugin_name, response.supported_features(),
                                    parsed_files)) {
    success = false;
  }
  if (!EnforceEditionsSupport(plugin_name, response.supported_features(),
                              static_cast<Edition>(response.minimum_edition()),
                              static_cast<Edition>(response.maximum_edition()),
                              parsed_files)) {
    success = false;
  }
  if (!response.error().empty()) {
    // Generator returned an error.
    *error = response.error();
    success = false;
  }

  return success;
}